

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall
kj::MainBuilder::MainImpl::wrapText
          (MainImpl *this,Vector<char> *output,StringPtr indent,StringPtr text)

{
  ArrayPtr<const_char> AVar1;
  char cVar2;
  size_t sVar3;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar4;
  ArrayPtr<const_char> AVar5;
  StringPtr SVar6;
  MainImpl *local_d0;
  char *local_c8;
  char local_b9;
  ArrayPtr<const_char> local_b8;
  uint local_a4;
  char local_9d;
  uint wrapPos;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  unsigned_long *local_78;
  unsigned_long *lineEnd;
  StringPtr local_60;
  undefined1 local_50 [8];
  NullableValue<unsigned_long> _lineEnd763;
  uint width;
  Vector<char> *output_local;
  MainImpl *this_local;
  StringPtr text_local;
  StringPtr indent_local;
  
  text_local.content.ptr = (char *)text.content.size_;
  this_local = (MainImpl *)text.content.ptr;
  text_local.content.size_ = (size_t)indent.content.ptr;
  sVar3 = StringPtr::size((StringPtr *)&text_local.content.size_);
  _lineEnd763.field_1.value._4_4_ = 0x50 - (int)sVar3;
  do {
    sVar3 = StringPtr::size((StringPtr *)&this_local);
    if (sVar3 == 0) {
      return;
    }
    Vector<char>::addAll<kj::StringPtr&>(output,(StringPtr *)&text_local.content.size_);
    StringPtr::findFirst(&local_60,(char)&this_local);
    other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_60);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_50,other);
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_60);
    puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_50);
    AVar5 = local_98;
    if (puVar4 == (unsigned_long *)0x0) {
LAB_00873143:
      AVar1.size_ = (size_t)text_local.content.ptr;
      AVar1.ptr = (char *)this_local;
      wrapPos = 0;
    }
    else {
      local_78 = kj::_::NullableValue<unsigned_long>::operator*
                           ((NullableValue<unsigned_long> *)local_50);
      AVar5 = local_98;
      if ((ulong)(uint)_lineEnd763.field_1.value._4_4_ < *local_78) goto LAB_00873143;
      AVar5 = StringPtr::first((StringPtr *)&this_local,*local_78 + 1);
      local_88 = AVar5;
      Vector<char>::addAll<kj::ArrayPtr<char_const>>(output,&local_88);
      AVar5 = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)&this_local,*local_78 + 1);
      wrapPos = 2;
      AVar1 = AVar5;
    }
    text_local.content.ptr = (char *)AVar1.size_;
    this_local = (MainImpl *)AVar1.ptr;
    local_98 = AVar5;
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_50);
    if (wrapPos == 0) {
      sVar3 = StringPtr::size((StringPtr *)&this_local);
      if (sVar3 <= (uint)_lineEnd763.field_1.value._4_4_) {
        Vector<char>::addAll<kj::StringPtr&>(output,(StringPtr *)&this_local);
        local_9d = '\n';
        Vector<char>::add<char>(output,&local_9d);
        return;
      }
      for (local_a4 = _lineEnd763.field_1.value._4_4_; local_a4 != 0; local_a4 = local_a4 - 1) {
        cVar2 = StringPtr::operator[]((StringPtr *)&this_local,(ulong)local_a4);
        if (cVar2 == ' ') {
          cVar2 = StringPtr::operator[]((StringPtr *)&this_local,(ulong)(local_a4 - 1));
          if (cVar2 != ' ') goto LAB_0087320c;
        }
      }
      local_a4 = _lineEnd763.field_1.value._4_4_;
LAB_0087320c:
      local_b8 = StringPtr::first((StringPtr *)&this_local,(ulong)local_a4);
      Vector<char>::addAll<kj::ArrayPtr<char_const>>(output,&local_b8);
      local_b9 = '\n';
      Vector<char>::add<char>(output,&local_b9);
      while( true ) {
        cVar2 = StringPtr::operator[]((StringPtr *)&this_local,(ulong)local_a4);
        if (cVar2 != ' ') break;
        local_a4 = local_a4 + 1;
      }
      cVar2 = StringPtr::operator[]((StringPtr *)&this_local,(ulong)local_a4);
      if (cVar2 == '\n') {
        local_a4 = local_a4 + 1;
      }
      SVar6 = StringPtr::slice((StringPtr *)&this_local,(ulong)local_a4);
      local_d0 = (MainImpl *)SVar6.content.ptr;
      this_local = local_d0;
      local_c8 = (char *)SVar6.content.size_;
      text_local.content.ptr = local_c8;
    }
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::wrapText(Vector<char>& output, StringPtr indent, StringPtr text) {
  uint width = 80 - indent.size();

  while (text.size() > 0) {
    output.addAll(indent);

    KJ_IF_SOME(lineEnd, text.findFirst('\n')) {
      if (lineEnd <= width) {
        output.addAll(text.first(lineEnd + 1));
        text = text.slice(lineEnd + 1);
        continue;
      }
    }

    if (text.size() <= width) {
      output.addAll(text);
      output.add('\n');
      break;
    }

    uint wrapPos = width;
    for (;; wrapPos--) {
      if (wrapPos == 0) {
        // Hmm, no good place to break words.  Just break in the middle.
        wrapPos = width;
        break;
      } else if (text[wrapPos] == ' ' && text[wrapPos - 1] != ' ') {
        // This position is a space and is preceded by a non-space.  Wrap here.
        break;
      }
    }

    output.addAll(text.first(wrapPos));
    output.add('\n');

    // Skip spaces after the text that was printed.
    while (text[wrapPos] == ' ') {
      ++wrapPos;
    }
    if (text[wrapPos] == '\n') {
      // Huh, apparently there were a whole bunch of spaces at the end of the line followed by a
      // newline.  Skip the newline as well so we don't print a blank line.
      ++wrapPos;
    }
    text = text.slice(wrapPos);
  }
}